

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O0

void __thiscall Lodtalk::StackInterpreter::localReturnValue(StackInterpreter *this,Oop value)

{
  StackMemory *pSVar1;
  bool bVar2;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar3;
  uint8_t *puVar4;
  StackInterpreter *local_28;
  pointer local_20;
  uint8_t *prevFramePointer;
  StackInterpreter *this_local;
  Oop value_local;
  
  prevFramePointer = (uint8_t *)this;
  this_local = (StackInterpreter *)value.field_0;
  local_20 = (pointer)StackMemory::getPrevFramePointer(this->stack);
  if (local_20 == (pointer)0x0) {
    local_28 = this_local;
    baseReturnValue(this,(Oop)this_local);
  }
  else {
    StackMemory::getCurrentFrame((StackMemory *)&stack0xffffffffffffffc8);
    bVar2 = StackFrame::hasContext((StackFrame *)&stack0xffffffffffffffc8);
    StackFrame::~StackFrame((StackFrame *)&stack0xffffffffffffffc8);
    if (bVar2) {
      paVar3 = &StackMemory::getThisContext(this->stack)->field_0;
      widowContext(this,(Context *)paVar3->header);
    }
    pSVar1 = this->stack;
    puVar4 = StackMemory::getFramePointer(this->stack);
    StackMemory::setStackPointer(pSVar1,puVar4);
    pSVar1 = this->stack;
    puVar4 = StackMemory::popPointer(this->stack);
    StackMemory::setFramePointer(pSVar1,puVar4);
    popPC(this);
    popMultiplesOops(this,this->argumentCount + 1);
    pushOop(this,(Oop)this_local);
    fetchFrameData(this);
    if (this->pc != 0) {
      fetchNextInstructionOpcode(this);
    }
  }
  return;
}

Assistant:

void localReturnValue(Oop value)
    {
        auto prevFramePointer = stack->getPrevFramePointer();
        if (prevFramePointer == nullptr)
        {
            return baseReturnValue(value);
        }

        // Widow the current context.
        if (stack->getCurrentFrame().hasContext())
            widowContext(reinterpret_cast<Context*> (stack->getThisContext().pointer));

        // Restore the stack into beginning of the frame pointer.
		stack->setStackPointer(stack->getFramePointer());
		stack->setFramePointer(stack->popPointer());

		// Pop the return pc
		popPC();

		// Pop the arguments and the receiver.
		popMultiplesOops(argumentCount + 1);

		// Push the return value.
		pushOop(value);

        // Re fetch the frame data to continue.
        fetchFrameData();

		// If there is no pc, then it means that we are returning.
		if(pc)
		{
			// Fetch the next instruction
			fetchNextInstructionOpcode();
		}
    }